

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

void __thiscall
embree::sse2::BVHNBuilderSAH<4,_embree::QuadMi<4>_>::build
          (BVHNBuilderSAH<4,_embree::QuadMi<4>_> *this)

{
  BVH **ppBVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer ppTVar5;
  PrimRef *pPVar6;
  MemoryMonitorInterface *pMVar7;
  Geometry *pGVar8;
  Scene *pSVar9;
  GTypeMask GVar10;
  double t0;
  double dVar11;
  undefined8 uVar12;
  long lVar13;
  PrimRef *pPVar14;
  NodeRef root;
  uint uVar15;
  size_t i;
  ulong uVar16;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *prims;
  pointer ppTVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  BVH *pBVar21;
  size_t sVar22;
  float fVar23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  PrimInfo pinfo;
  string local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  if ((this->mesh != (Geometry *)0x0) && (this->mesh->numPrimitives != this->numPreviousPrimitives))
  {
    pBVar21 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar21->alloc);
    ppTVar5 = (pBVar21->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar17 = (pBVar21->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar17 != ppTVar5;
        ppTVar17 = ppTVar17 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar17,&pBVar21->alloc);
    }
    ppTVar17 = (pBVar21->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar21->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar17) {
      (pBVar21->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar17;
    }
    LOCK();
    (pBVar21->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar21->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar21->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar21->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar21->alloc).usedBlocks._M_b._M_p,(pBVar21->alloc).device,
                 (pBVar21->alloc).useUSM);
    }
    LOCK();
    (pBVar21->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar21->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      FastAllocator::Block::clear_list
                ((pBVar21->alloc).freeBlocks._M_b._M_p,(pBVar21->alloc).device,
                 (pBVar21->alloc).useUSM);
    }
    LOCK();
    (pBVar21->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    for (lVar13 = -0x40; lVar13 != 0; lVar13 = lVar13 + 8) {
      LOCK();
      *(undefined8 *)((long)&(pBVar21->alloc).threadBlocks[0]._M_b._M_p + lVar13) = 0;
      UNLOCK();
      LOCK();
      *(undefined8 *)((long)&(pBVar21->alloc).threadBlocks[8]._M_b._M_p + lVar13) = 0;
      UNLOCK();
    }
    sVar20 = (pBVar21->alloc).primrefarray.size_alloced;
    pPVar6 = (pBVar21->alloc).primrefarray.items;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar20 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar20 << 5,(pBVar21->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar20 != 0) {
      pMVar7 = (pBVar21->alloc).primrefarray.alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 * -0x20,1);
    }
    (pBVar21->alloc).primrefarray.size_active = 0;
    (pBVar21->alloc).primrefarray.size_alloced = 0;
    (pBVar21->alloc).primrefarray.items = (PrimRef *)0x0;
  }
  if ((this->settings).primrefarrayalloc != 0xffffffffffffffff) {
    FastAllocator::unshare(&this->bvh->alloc,(int)this + 0x28);
  }
  pGVar8 = this->mesh;
  if (pGVar8 == (Geometry *)0x0) {
    pSVar9 = this->scene;
    GVar10 = this->gtype_;
    uVar15 = (uint)GVar10;
    if ((uVar15 >> 0x14 & 1) == 0) {
      sVar20 = 0;
    }
    else {
      sVar20 = (pSVar9->world).numTriangles;
    }
    if ((uVar15 >> 0x15 & 1) != 0) {
      sVar20 = sVar20 + (pSVar9->world).numQuads;
    }
    if ((GVar10 & MTY_CURVE2) != ~MTY_ALL) {
      sVar20 = sVar20 + (pSVar9->world).numLineSegments;
    }
    if ((GVar10 & MTY_CURVE4) != ~MTY_ALL) {
      sVar20 = sVar20 + (pSVar9->world).numBezierCurves;
    }
    if ((GVar10 & MTY_POINTS) != ~MTY_ALL) {
      sVar20 = sVar20 + (pSVar9->world).numPoints;
    }
    if ((uVar15 >> 0x17 & 1) != 0) {
      sVar20 = sVar20 + (pSVar9->world).numSubdivPatches;
    }
    if ((uVar15 >> 0x1d & 1) != 0) {
      sVar20 = sVar20 + (pSVar9->world).numUserGeometries;
    }
    if ((uVar15 >> 0x1e & 1) != 0) {
      sVar20 = sVar20 + (pSVar9->world).numInstancesCheap;
    }
    if ((int)uVar15 < 0) {
      sVar20 = sVar20 + (pSVar9->world).numInstancesExpensive;
    }
    if ((uVar15 >> 0x18 & 1) != 0) {
      sVar20 = sVar20 + (pSVar9->world).numInstanceArrays;
    }
    if ((uVar15 >> 0x16 & 1) != 0) {
      sVar20 = sVar20 + (pSVar9->world).numGrids;
    }
    this->numPreviousPrimitives = (uint)sVar20;
    if (sVar20 == 0) goto LAB_00472b30;
    pBVar21 = this->bvh;
    std::__cxx11::to_string(&local_98,4);
    std::operator+(&local_108,"sse2::BVH",&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   &local_108,"BuilderSAH");
  }
  else {
    sVar20 = (size_t)pGVar8->numPrimitives;
    this->numPreviousPrimitives = pGVar8->numPrimitives;
    if (sVar20 == 0) {
LAB_00472b30:
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      sVar20 = (this->prims).size_alloced;
      pPVar6 = (this->prims).items;
      if (pPVar6 != (PrimRef *)0x0) {
        if (sVar20 << 5 < 0x1c00000) {
          alignedFree(pPVar6);
        }
        else {
          os_free(pPVar6,sVar20 << 5,(this->prims).alloc.hugepages);
        }
      }
      if (sVar20 != 0) {
        pMVar7 = (this->prims).alloc.device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 * -0x20,1);
      }
      (this->prims).size_active = 0;
      (this->prims).size_alloced = 0;
      (this->prims).items = (PrimRef *)0x0;
      return;
    }
    pBVar21 = this->bvh;
    std::__cxx11::string::string((string *)&pinfo,"",(allocator *)&local_108);
  }
  ppBVar1 = &this->bvh;
  t0 = BVHN<4>::preBuild(pBVar21,(string *)&pinfo);
  std::__cxx11::string::~string((string *)&pinfo);
  if (pGVar8 == (Geometry *)0x0) {
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if (this->primrefarrayalloc == true) {
    uVar16 = 0xffffffffffffffff;
    if (999999 < sVar20) {
      uVar16 = sVar20 / 1000;
    }
    (this->settings).primrefarrayalloc = uVar16;
  }
  if (this->mesh != (Geometry *)0x0) {
    ((*ppBVar1)->alloc).atype = EMBREE_OS_MALLOC;
  }
  dVar11 = (double)(sVar20 + 3 >> 2) * 1.2 * 96.0;
  uVar16 = (ulong)dVar11;
  sVar22 = ((long)(dVar11 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) +
           (sVar20 * 0xe0 >> 4);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar22);
  sVar22 = FastAllocator::fixSingleThreadThreshold(&this->bvh->alloc,4,0x400,sVar20,sVar22);
  (this->settings).singleThreadThreshold = sVar22;
  uVar16 = (this->prims).size_alloced;
  uVar19 = uVar16;
  if ((uVar16 < sVar20) && (uVar18 = uVar16, uVar19 = sVar20, uVar16 != 0)) {
    for (; uVar19 = uVar18, uVar18 < sVar20; uVar18 = uVar18 * 2 + (ulong)(uVar18 * 2 == 0)) {
    }
  }
  psVar2 = &(this->prims).size_active;
  if (sVar20 < (this->prims).size_active) {
    *psVar2 = sVar20;
  }
  prims = (EVP_PKEY_CTX *)&this->prims;
  if (uVar16 == uVar19) {
    *psVar2 = sVar20;
  }
  else {
    pMVar7 = (this->prims).alloc.device;
    pPVar6 = (this->prims).items;
    uVar16 = uVar19 << 5;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar16,0);
    if (uVar16 < 0x1c00000) {
      pPVar14 = (PrimRef *)alignedMalloc(uVar16,0x20);
    }
    else {
      pPVar14 = (PrimRef *)os_malloc(uVar16,&(this->prims).alloc.hugepages);
    }
    (this->prims).items = pPVar14;
    lVar13 = 0x10;
    for (uVar16 = 0; uVar16 < *psVar2; uVar16 = uVar16 + 1) {
      pPVar14 = (this->prims).items;
      puVar3 = (undefined8 *)((long)pPVar6 + lVar13 + -0x10);
      uVar12 = puVar3[1];
      puVar4 = (undefined8 *)((long)pPVar14 + lVar13 + -0x10);
      *puVar4 = *puVar3;
      puVar4[1] = uVar12;
      puVar3 = (undefined8 *)((long)&(pPVar6->lower).field_0 + lVar13);
      uVar12 = puVar3[1];
      puVar4 = (undefined8 *)((long)&(pPVar14->lower).field_0 + lVar13);
      *puVar4 = *puVar3;
      puVar4[1] = uVar12;
      lVar13 = lVar13 + 0x20;
    }
    sVar22 = (this->prims).size_alloced;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar22 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar22 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar22 != 0) {
      pMVar7 = (((mvector<PrimRef> *)prims)->alloc).device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar22 * -0x20,1);
    }
    (this->prims).size_active = sVar20;
    (this->prims).size_alloced = uVar19;
  }
  if (this->mesh == (Geometry *)0x0) {
    sse2::createPrimRefArray
              (&pinfo,this->scene,this->gtype_,false,sVar20,(mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  else {
    sse2::createPrimRefArray
              (&pinfo,this->mesh,this->geomID_,sVar20,(mvector<PrimRef> *)prims,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
  }
  local_78._8_8_ = this->bvh;
  if (pinfo.end == pinfo.begin) {
    (*(((BVH *)local_78._8_8_)->super_AccelData).super_RefCount._vptr_RefCount[5])();
    sVar20 = (this->prims).size_alloced;
    pPVar6 = (this->prims).items;
    if (pPVar6 != (PrimRef *)0x0) {
      if (sVar20 << 5 < 0x1c00000) {
        alignedFree(pPVar6);
      }
      else {
        os_free(pPVar6,sVar20 << 5,(this->prims).alloc.hugepages);
      }
    }
    if (sVar20 != 0) {
      pMVar7 = (((mvector<PrimRef> *)prims)->alloc).device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar20 * -0x20,1);
    }
    *psVar2 = 0;
    (this->prims).size_alloced = 0;
    (this->prims).items = (PrimRef *)0x0;
  }
  else {
    local_78._0_8_ = &PTR_createLeaf_021dc250;
    root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                     ((BVHNBuilderV *)&local_78,&((BVH *)local_78._8_8_)->alloc,
                      &(((BVH *)local_78._8_8_)->scene->progressInterface).
                       super_BuildProgressMonitor,(this->prims).items,&pinfo,this->settings);
    local_78._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_78._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_68._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    local_68._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    local_58._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
    local_58._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_;
    local_48._0_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
    local_48._8_8_ =
         pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
    BVHN<4>::set(this->bvh,(NodeRef)root.ptr,(LBBox3fa *)&local_78,pinfo.end - pinfo.begin);
    fVar23 = (float)(pinfo.end - pinfo.begin) * 0.005;
    uVar16 = (ulong)fVar23;
    ctx = (EVP_PKEY_CTX *)((long)(fVar23 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16);
    BVHN<4>::layoutLargeNodes(this->bvh,(size_t)ctx);
    if ((this->settings).primrefarrayalloc == 0xffffffffffffffff) {
      if ((this->scene != (Scene *)0x0) &&
         ((this->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
        sVar20 = (this->prims).size_alloced;
        pPVar6 = (this->prims).items;
        if (pPVar6 != (PrimRef *)0x0) {
          ctx = (EVP_PKEY_CTX *)(sVar20 << 5);
          if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
            alignedFree(pPVar6);
          }
          else {
            os_free(pPVar6,(size_t)ctx,(this->prims).alloc.hugepages);
          }
        }
        if (sVar20 != 0) {
          pMVar7 = (((mvector<PrimRef> *)prims)->alloc).device;
          ctx = (EVP_PKEY_CTX *)(sVar20 * -0x20);
          (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,ctx,1);
        }
        *psVar2 = 0;
        (this->prims).size_alloced = 0;
        (this->prims).items = (PrimRef *)0x0;
      }
    }
    else {
      FastAllocator::share(&(*ppBVar1)->alloc,(mvector<PrimRef> *)prims);
      ctx = prims;
    }
    BVHN<4>::cleanup(*ppBVar1,ctx);
    BVHN<4>::postBuild(*ppBVar1,t0);
  }
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

        /* if we use the primrefarray for allocations we have to take it back from the BVH */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.unshare(prims);

	/* skip build for empty scene */
        const size_t numPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(gtype_,false);
        numPreviousPrimitives = numPrimitives;
        if (numPrimitives == 0) {
          bvh->clear();
          prims.clear();
          return;
        }

        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + "BuilderSAH");

#if PROFILE
        profile(2,PROFILE_RUNS,numPrimitives,[&] (ProfileTimer& timer) {
#endif

            /* create primref array */
            if (primrefarrayalloc) {
              settings.primrefarrayalloc = numPrimitives/1000;
              if (settings.primrefarrayalloc < 1000)
                settings.primrefarrayalloc = inf;
            }

            /* enable os_malloc for two level build */
            if (mesh)
              bvh->alloc.setOSallocation(true);

            /* initialize allocator */
            const size_t node_bytes = numPrimitives*sizeof(typename BVH::AABBNodeMB)/(4*N);
            const size_t leaf_bytes = size_t(1.2*Primitive::blocks(numPrimitives)*sizeof(Primitive));
            bvh->alloc.init_estimate(node_bytes+leaf_bytes);
            settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,numPrimitives,node_bytes+leaf_bytes);
            prims.resize(numPrimitives);

            PrimInfo pinfo = mesh ?
              createPrimRefArray(mesh,geomID_,numPrimitives,prims,bvh->scene->progressInterface) :
              createPrimRefArray(scene,gtype_,false,numPrimitives,prims,bvh->scene->progressInterface);

            /* pinfo might has zero size due to invalid geometry */
            if (unlikely(pinfo.size() == 0))
            {
              bvh->clear();
              prims.clear();
              return;
            }

            /* call BVH builder */
            NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeaf<N,Primitive>(bvh),bvh->scene->progressInterface,prims.data(),pinfo,settings);
            bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
            bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

#if PROFILE
          });
#endif

        /* if we allocated using the primrefarray we have to keep it alive */
        if (settings.primrefarrayalloc != size_t(inf))
          bvh->alloc.share(prims);

        /* for static geometries we can do some cleanups */
        else if (scene && scene->isStaticAccel()) {
          prims.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }